

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::Reader::Reader(Reader *this)

{
  Features FVar1;
  Reader *this_local;
  
  std::stack<Json::Value*,std::deque<Json::Value*,std::allocator<Json::Value*>>>::
  stack<std::deque<Json::Value*,std::allocator<Json::Value*>>,void>
            ((stack<Json::Value*,std::deque<Json::Value*,std::allocator<Json::Value*>>> *)this);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::deque
            (&this->errors_);
  std::__cxx11::string::string((string *)&this->document_);
  this->begin_ = (Location)0x0;
  this->end_ = (Location)0x0;
  this->current_ = (Location)0x0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::__cxx11::string::string((string *)&this->commentsBefore_);
  FVar1 = Features::all();
  this->features_ = FVar1;
  this->collectComments_ = false;
  return;
}

Assistant:

Reader::Reader() : features_(Features::all()) {}